

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

ssize_t __thiscall Bstrlib::CBString::read(CBString *this,int __fd,void *__buf,size_t __nbytes)

{
  CBStringException *this_00;
  bstring x;
  undefined4 in_register_00000034;
  bstring b;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  CBStringException bstr__cppwrapper_exception;
  void *parm_local;
  bNread readPtr_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = __buf;
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"CBString::Write protection error",&local_71);
    CBStringException::CBStringException((CBStringException *)local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_50);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  x = bread((bNread)CONCAT44(in_register_00000034,__fd),__buf);
  if (x == (bstring)0x0) {
    (this->super_tagbstring).slen = 0;
    this_local._4_4_ = 0xffffffff;
  }
  else {
    operator=(this,x);
    bdestroy(x);
    this_local._4_4_ = 0;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int CBString::read (bNread readPtr, void * parm) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	bstring b = bread (readPtr, parm);
	if (b == NULL) {
		slen = 0;
		return -1;
	}
	*this = *b;
	bdestroy (b);
	return 0;
}